

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strongly_connected_components.h
# Opt level: O0

void __thiscall wasm::SCCs<IntIt,_GraphSCCs>::stepToNextElem(SCCs<IntIt,_GraphSCCs> *this)

{
  value_type vVar1;
  bool bVar2;
  reference pvVar3;
  uint *puVar4;
  mapped_type *pmVar5;
  SCCs<IntIt,_GraphSCCs> *this_local;
  
  bVar2 = std::optional::operator_cast_to_bool((optional *)&this->currRoot);
  if (!bVar2) {
    __assert_fail("currRoot",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/strongly_connected_components.h"
                  ,0x97,
                  "void wasm::SCCs<IntIt, GraphSCCs>::stepToNextElem() [It = IntIt, Class = GraphSCCs]"
                 );
  }
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back(&this->stack);
  vVar1 = *pvVar3;
  puVar4 = std::optional<unsigned_int>::operator*(&this->currRoot);
  if (vVar1 == *puVar4) {
    std::optional<unsigned_int>::operator=(&this->currRoot);
  }
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back(&this->stack);
  pmVar5 = std::
           unordered_map<unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>_>_>
           ::operator[](&this->elementInfo,pvVar3);
  pmVar5->onStack = false;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back(&this->stack);
  return;
}

Assistant:

void stepToNextElem() {
    assert(currRoot);
    if (stack.back() == *currRoot) {
      // This was the last element in the current SCC. We have to find the next
      // SCC now.
      currRoot = std::nullopt;
    }
    elementInfo[stack.back()].onStack = false;
    stack.pop_back();
  }